

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isValidForSequence(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  bool bVar4;
  
  pTVar2 = getCanonicalType(this);
  pTVar3 = getCanonicalType(pTVar2);
  bVar1 = IntegralType::isKind((pTVar3->super_Symbol).kind);
  bVar4 = true;
  if (!bVar1) {
    pTVar3 = getCanonicalType(pTVar2);
    if ((pTVar3->super_Symbol).kind != StringType) {
      pTVar2 = getCanonicalType(pTVar2);
      bVar4 = (pTVar2->super_Symbol).kind == FloatingType;
    }
  }
  return bVar4;
}

Assistant:

bool Type::isValidForSequence() const {
    // Type must be cast compatible with an integral type to be valid.
    auto& ct = getCanonicalType();
    return ct.isIntegral() || ct.isString() || ct.isFloating();
}